

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall
QL_Manager::Delete(QL_Manager *this,char *relName,int nConditions,Condition *conditions)

{
  char *pcVar1;
  QL_Manager *this_00;
  RC RVar2;
  size_t sVar3;
  ostream *poVar4;
  RelCatEntry *pRVar5;
  AttrCatEntry *pAVar6;
  long lVar7;
  long lVar8;
  Condition *c;
  QL_Manager *this_01;
  ulong uVar9;
  QL_Node *topNode;
  QL_Node *local_48;
  char *local_40;
  QL_Manager *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Delete\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName = ",0xd);
  local_40 = relName;
  local_38 = this;
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar3 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   nCondtions = ",0x10);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,nConditions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (0 < nConditions) {
    uVar9 = 0;
    c = conditions;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   conditions[",0xe)
      ;
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]:",2);
      poVar4 = operator<<(poVar4,c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      uVar9 = uVar9 + 1;
      c = c + 1;
    } while ((uint)nConditions != uVar9);
  }
  this_00 = local_38;
  Reset(local_38);
  this_00->condptr = conditions;
  this_00->nConds = nConditions;
  pRVar5 = (RelCatEntry *)malloc(0x34);
  this_00->relEntries = pRVar5;
  pRVar5->relName[0] = '\0';
  pRVar5->relName[1] = '\0';
  pRVar5->relName[2] = '\0';
  pRVar5->relName[3] = '\0';
  pRVar5->relName[4] = '\0';
  pRVar5->relName[5] = '\0';
  pRVar5->relName[6] = '\0';
  pRVar5->relName[7] = '\0';
  pRVar5->relName[8] = '\0';
  pRVar5->relName[9] = '\0';
  pRVar5->relName[10] = '\0';
  pRVar5->relName[0xb] = '\0';
  pRVar5->relName[0xc] = '\0';
  pRVar5->relName[0xd] = '\0';
  pRVar5->relName[0xe] = '\0';
  pRVar5->relName[0xf] = '\0';
  pRVar5->relName[9] = '\0';
  pRVar5->relName[10] = '\0';
  pRVar5->relName[0xb] = '\0';
  pRVar5->relName[0xc] = '\0';
  pRVar5->relName[0xd] = '\0';
  pRVar5->relName[0xe] = '\0';
  pRVar5->relName[0xf] = '\0';
  pRVar5->relName[0x10] = '\0';
  pRVar5->relName[0x11] = '\0';
  pRVar5->relName[0x12] = '\0';
  pRVar5->relName[0x13] = '\0';
  pRVar5->relName[0x14] = '\0';
  pRVar5->relName[0x15] = '\0';
  pRVar5->relName[0x16] = '\0';
  pRVar5->relName[0x17] = '\0';
  pRVar5->relName[0x18] = '\0';
  pRVar5->tupleLength = 0;
  pRVar5->attrCount = 0;
  pRVar5->indexCount = 0;
  pRVar5->indexCurrNum = 0;
  pRVar5->numTuples = 0;
  pRVar5->statsInitialized = false;
  *(undefined3 *)&pRVar5->field_0x31 = 0;
  pRVar5->statsInitialized = true;
  RVar2 = SetUpOneRelation(this_00,local_40);
  pAVar6 = (AttrCatEntry *)this_00->relEntries;
  if (RVar2 == 0) {
    pAVar6 = (AttrCatEntry *)malloc((long)*(int *)(pAVar6->attrName + 7) * 0x54);
    this_00->attrEntries = pAVar6;
    pAVar6->relName[0] = '\0';
    pAVar6->relName[1] = '\0';
    pAVar6->relName[2] = '\0';
    pAVar6->relName[3] = '\0';
    pAVar6->relName[4] = '\0';
    pAVar6->relName[5] = '\0';
    pAVar6->relName[6] = '\0';
    pAVar6->relName[7] = '\0';
    pAVar6->relName[8] = '\0';
    pAVar6->relName[9] = '\0';
    pAVar6->relName[10] = '\0';
    pAVar6->relName[0xb] = '\0';
    pAVar6->relName[0xc] = '\0';
    pAVar6->relName[0xd] = '\0';
    pAVar6->relName[0xe] = '\0';
    pAVar6->relName[0xf] = '\0';
    pAVar6->relName[0x10] = '\0';
    pAVar6->relName[0x11] = '\0';
    pAVar6->relName[0x12] = '\0';
    pAVar6->relName[0x13] = '\0';
    pAVar6->relName[0x14] = '\0';
    pAVar6->relName[0x15] = '\0';
    pAVar6->relName[0x16] = '\0';
    pAVar6->relName[0x17] = '\0';
    *(undefined8 *)(pAVar6->relName + 0x18) = 0;
    pAVar6->attrName[7] = '\0';
    pAVar6->attrName[8] = '\0';
    pAVar6->attrName[9] = '\0';
    pAVar6->attrName[10] = '\0';
    pAVar6->attrName[0xb] = '\0';
    pAVar6->attrName[0xc] = '\0';
    pAVar6->attrName[0xd] = '\0';
    pAVar6->attrName[0xe] = '\0';
    pAVar6->attrName[0xf] = '\0';
    pAVar6->attrName[0x10] = '\0';
    pAVar6->attrName[0x11] = '\0';
    pAVar6->attrName[0x12] = '\0';
    pAVar6->attrName[0x13] = '\0';
    pAVar6->attrName[0x14] = '\0';
    pAVar6->attrName[0x15] = '\0';
    pAVar6->attrName[0x16] = '\0';
    *(undefined8 *)(pAVar6->attrName + 0x17) = 0;
    pAVar6->attrType = INT;
    pAVar6->attrLength = 0;
    pAVar6->indexNo = 0;
    pAVar6->attrNum = 0;
    pAVar6->numDistinct = 0;
    pAVar6->maxValue = 0.0;
    pAVar6->minValue = 0.0;
    pRVar5 = this_00->relEntries;
    if (0 < pRVar5->attrCount) {
      lVar7 = 0x50;
      lVar8 = 0;
      do {
        pAVar6 = this_00->attrEntries;
        pcVar1 = pAVar6->relName + lVar7 + -0x30;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar6->relName + lVar7 + -0x40;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar6->relName + lVar7 + -0x50;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        (pAVar6->relName + lVar7 + -0x20)[0] = '\0';
        (pAVar6->relName + lVar7 + -0x20)[1] = '\0';
        pcVar1 = pAVar6->relName + lVar7 + -0x1c;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar6->relName + lVar7 + -0xc;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1 = pAVar6->relName + lVar7 + -4;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = -0x80;
        pcVar1[3] = '\0';
        pcVar1[4] = -1;
        pcVar1[5] = -1;
        pcVar1[6] = '\x7f';
        pcVar1[7] = '\x7f';
        lVar8 = lVar8 + 1;
        pRVar5 = this_00->relEntries;
        lVar7 = lVar7 + 0x54;
      } while (lVar8 < pRVar5->attrCount);
    }
    RVar2 = SM_Manager::GetAttrForRel(this_00->smm,pRVar5,this_00->attrEntries,&this_00->attrToRel);
    if ((RVar2 == 0) && (RVar2 = ParseConditions(this_00,nConditions,conditions), RVar2 == 0)) {
      RVar2 = SetUpFirstNode(this_00,&local_48);
      if (RVar2 != 0) {
        return RVar2;
      }
      if (bQueryPlans != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PRINTING QUERY PLAN",0x13);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        (*local_48->_vptr_QL_Node[5])(local_48,0);
      }
      this_01 = this_00;
      RVar2 = RunDelete(this_00,local_48);
      if (RVar2 != 0) {
        return RVar2;
      }
      RVar2 = CleanUpNodes(this_01,local_48);
      if (RVar2 != 0) {
        return RVar2;
      }
      free(this_00->relEntries);
      free(this_00->attrEntries);
      return 0;
    }
    free(this_00->relEntries);
    pAVar6 = this_00->attrEntries;
  }
  free(pAVar6);
  return RVar2;
}

Assistant:

RC QL_Manager::Delete(const char *relName,
                      int nConditions, const Condition conditions[])
{
  int i;

  cout << "Delete\n";

  cout << "   relName = " << relName << "\n";
  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  RC rc = 0;
  Reset();
  condptr = conditions;
  nConds = nConditions;
  
  // Make space for relation 
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry));
  memset((void*)relEntries, 0, sizeof(*relEntries));
  *relEntries = (RelCatEntry) {"\0", 0, 0, 0, 0, 0, true};
  if((rc = SetUpOneRelation(relName))){
    free(relEntries);
    return (rc);
  }
  // Make space for the list of attributes in this relation
  attrEntries = (AttrCatEntry *)malloc(relEntries->attrCount * sizeof(AttrCatEntry));
  memset((void*)attrEntries, 0, sizeof(*attrEntries));
  for(int i= 0 ; i < relEntries->attrCount; i++){
    *(attrEntries+i) = (AttrCatEntry) {"\0", "\0", 0, INT, 0, 0, 0, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = smm.GetAttrForRel(relEntries, attrEntries, attrToRel))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

  // Makes sure that the conditions are appropriate
  if(rc = ParseConditions(nConditions, conditions)){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

   // Create the query tree nodes
    QL_Node *topNode;
    if((rc = SetUpFirstNode(topNode)))
    return (rc);

  // Print the query plan
  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }
  
  if((rc = RunDelete(topNode))) // Run delete
    return (rc);
  
  if(rc = CleanUpNodes(topNode)) // Clean up the nodes
    return (rc);

  free(relEntries);
  free(attrEntries);

  return 0;
}